

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>,void>
               (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
                *container,ostream *os)

{
  bool bVar1;
  ostream *in_RSI;
  int *elem;
  const_iterator __end0;
  const_iterator __begin0;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *__range3;
  size_t count;
  size_t kMaxCount;
  const_iterator *in_stack_ffffffffffffffa8;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>
  *in_stack_ffffffffffffffb0;
  long local_20;
  
  std::operator<<(in_RSI,'{');
  local_20 = 0;
  google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::begin
            ((sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
             0x9c8013);
  google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>::end
            (in_stack_ffffffffffffffb0);
  do {
    bVar1 = google::
            const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
            ::operator!=((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                          *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    if (!bVar1) {
LAB_009c80c4:
      if (local_20 != 0) {
        std::operator<<(in_RSI,' ');
      }
      std::operator<<(in_RSI,'}');
      return;
    }
    in_stack_ffffffffffffffb0 =
         (sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *)
         google::
         const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
         ::operator*((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                      *)0x9c8050);
    if ((local_20 != 0) && (std::operator<<(in_RSI,','), local_20 == 0x20)) {
      std::operator<<(in_RSI," ...");
      goto LAB_009c80c4;
    }
    std::operator<<(in_RSI,' ');
    UniversalPrint<int>((int *)in_stack_ffffffffffffffb0,(ostream *)in_stack_ffffffffffffffa8);
    local_20 = local_20 + 1;
    google::
    const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
    ::operator++((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                  *)in_stack_ffffffffffffffb0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }